

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O3

void slider_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  int iVar2;
  _glist *p_Var3;
  int d;
  int c;
  int b;
  int a;
  char tag [128];
  
  iVar2 = glist_isvisible(glist);
  if (iVar2 != 0) {
    iVar2 = ((_glist *)client[3].g_pd)->gl_zoom;
    p_Var3 = glist_getcanvas((_glist *)client[3].g_pd);
    text_xpix((t_text *)client,glist);
    text_ypix((t_text *)client,glist);
    iVar1 = *(int *)((long)&client[0x49].g_pd + 4);
    sprintf(tag,"%lxKNOB",client);
    slider_knob_position((t_slider *)client,glist,((iVar1 + 0x32) / 100) * iVar2,&a,&b,&c,&d);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var3,"coords",tag,(ulong)(uint)a,(ulong)(uint)b,
                (ulong)(uint)c,(ulong)(uint)d);
  }
  return;
}

Assistant:

static void slider_draw_update(t_gobj *client, t_glist *glist)
{
    t_slider *x = (t_slider *)client;
    int a, b, c, d;
    if (glist_isvisible(glist))
    {
        const int zoom = IEMGUI_ZOOM(x);
        t_canvas *canvas = glist_getcanvas(glist);
        int xpos = text_xpix(&x->x_gui.x_obj, glist);
        int ypos = text_ypix(&x->x_gui.x_obj, glist);
        int val = ((x->x_val + 50) / 100) * zoom;
        char tag[128];
        sprintf(tag, "%lxKNOB", x);

        slider_knob_position(x, glist, val, &a, &b, &c, &d);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag, a, b, c, d);
    }
}